

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68000_cmpi_8(m68k_info *info)

{
  uint imm;
  ulong uVar1;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  imm = 0xaa;
  if (uVar1 + 2 <= info->code_len) {
    imm = (uint)info->code[uVar1 + 1];
  }
  info->pc = info->pc + 2;
  build_imm_ea(info,0x32,'\x01',imm);
  return;
}

Assistant:

static unsigned int peek_imm_8(const m68k_info *info)  { return (m68k_read_safe_16((info), (info)->pc)&0xff); }